

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  void *pvVar2;
  int *piVar3;
  __m256i alVar4;
  __m256i c;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  undefined1 auVar5 [32];
  uint uVar6;
  parasail_result_t *ppVar7;
  __m256i *b_13;
  __m256i *ptr;
  __m256i *b_14;
  __m256i *ptr_00;
  __m256i *ptr_01;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  char *__format;
  __m256i *__return_storage_ptr__;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  size_t size;
  size_t __n;
  bool bVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  size_t sVar29;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  int iVar30;
  parasail_matrix_t *ppVar31;
  long local_268;
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_138 [32];
  undefined1 local_d8 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar13 = "profile";
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar13 = "profile->profile64.score";
    }
    else {
      ppVar31 = profile->matrix;
      if (ppVar31 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar13 = "profile->matrix";
      }
      else {
        uVar18 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar13 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar13 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "open";
        }
        else {
          if (-1 < gap) {
            uVar19 = uVar18 + 3;
            uVar12 = CONCAT44(0,open);
            iVar30 = ppVar31->min;
            uVar8 = 0x8000000000000000 - (long)iVar30;
            if (iVar30 != -open && SBORROW4(iVar30,-open) == iVar30 + open < 0) {
              uVar8 = uVar12 | 0x8000000000000000;
            }
            iVar30 = ppVar31->max;
            ppVar7 = parasail_result_new_table1((uint)uVar19 & 0x7ffffffc,s2Len);
            if (ppVar7 != (parasail_result_t *)0x0) {
              size = uVar19 >> 2;
              ppVar7->flag = ppVar7->flag | 0x4820404;
              b_13 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              b_14 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              sVar29 = size;
              ptr_01 = parasail_memalign___m256i(0x20,size);
              if (ptr_01 != (__m256i *)0x0 &&
                  ((ptr_00 != (__m256i *)0x0 && b_14 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && b_13 != (__m256i *)0x0))) {
                auVar22._4_4_ = 0;
                auVar22._0_4_ = gap;
                auVar22._8_4_ = gap;
                auVar22._12_4_ = 0;
                auVar22._16_4_ = gap;
                auVar22._20_4_ = 0;
                auVar22._24_4_ = gap;
                auVar22._28_4_ = 0;
                uVar8 = uVar8 + 1;
                lVar15 = 0x7ffffffffffffffe - (long)iVar30;
                lVar9 = (long)-(gap * (int)size);
                auVar23._8_8_ = lVar9;
                auVar23._0_8_ = lVar9;
                auVar23._16_8_ = lVar9;
                auVar23._24_8_ = lVar9;
                auVar23 = vpblendd_avx2(auVar23,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                auVar23 = vpaddq_avx2(ZEXT832(uVar8),auVar23);
                alVar4[1]._0_4_ = in_stack_fffffffffffffd60;
                alVar4[0] = sVar29;
                alVar4[1]._4_4_ = in_stack_fffffffffffffd64;
                alVar4[2] = uVar8;
                alVar4[3] = (longlong)ptr_01;
                uVar19 = uVar8;
                parasail_memset___m256i(b_14,alVar4,size);
                c[1]._0_4_ = in_stack_fffffffffffffd60;
                c[0] = sVar29;
                c[1]._4_4_ = in_stack_fffffffffffffd64;
                c[2] = uVar19;
                c[3] = (longlong)ptr_01;
                __return_storage_ptr__ = b_13;
                parasail_memset___m256i(b_13,c,size);
                auVar26._8_4_ = open;
                auVar26._0_8_ = uVar12;
                auVar26._12_4_ = 0;
                auVar26._16_4_ = open;
                auVar26._20_4_ = 0;
                auVar26._24_4_ = open;
                auVar26._28_4_ = 0;
                alVar4 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar26);
                uVar6 = (int)size - 1;
                for (uVar11 = uVar6; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
                  ptr_01[uVar11] = alVar4;
                  alVar4 = (__m256i)vpsubq_avx2((undefined1  [32])alVar4,auVar22);
                }
                uVar10 = (ulong)(uint)s2Len;
                __n = size << 5;
                lVar9 = size * uVar10;
                local_268 = 0;
                local_1b8._8_8_ = lVar15;
                local_1b8._0_8_ = lVar15;
                local_1b8._16_8_ = lVar15;
                local_1b8._24_8_ = lVar15;
                local_1d8._8_8_ = uVar8;
                local_1d8._0_8_ = uVar8;
                local_1d8._16_8_ = uVar8;
                local_1d8._24_8_ = uVar8;
                iVar30 = 0;
                local_138 = local_1d8;
                local_d8 = local_1d8;
                for (uVar17 = 0; uVar11 = (uint)size, uVar17 != uVar10; uVar17 = uVar17 + 1) {
                  alVar4 = b_14[uVar6];
                  auVar26 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar26 = vpalignr_avx2((undefined1  [32])alVar4,auVar26,8);
                  iVar14 = ppVar31->mapper[(byte)s2[uVar17]];
                  auVar28 = ZEXT1664((undefined1  [16])0x0);
                  local_238._8_8_ = uVar8;
                  local_238._0_8_ = uVar8;
                  local_238._16_8_ = uVar8;
                  local_238._24_8_ = uVar8;
                  size = sVar29;
                  for (sVar20 = 0; auVar27 = auVar28._0_32_, __n != sVar20; sVar20 = sVar20 + 0x20)
                  {
                    auVar25 = *(undefined1 (*) [32])((long)*b_14 + sVar20);
                    auVar24 = vpsubq_avx2(*(undefined1 (*) [32])((long)*b_13 + sVar20),auVar22);
                    auVar5._8_4_ = open;
                    auVar5._0_8_ = uVar12;
                    auVar5._12_4_ = 0;
                    auVar5._16_4_ = open;
                    auVar5._20_4_ = 0;
                    auVar5._24_4_ = open;
                    auVar5._28_4_ = 0;
                    vpsubq_avx2(auVar25,auVar5);
                    vpaddq_avx2(auVar26,*(undefined1 (*) [32])
                                         ((long)pvVar2 +
                                         sVar20 + (long)(int)(iVar14 * uVar11) * 0x20));
                    a[1]._0_4_ = in_stack_fffffffffffffd60;
                    a[0] = size;
                    a[1]._4_4_ = iVar30;
                    a[2] = uVar19;
                    a[3] = (longlong)ptr_01;
                    b[1] = (longlong)ptr_00;
                    b[0] = uVar18;
                    b[2] = (longlong)ppVar31;
                    b[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
                    vpaddq_avx2(auVar27,*(undefined1 (*) [32])((long)*ptr_01 + sVar20));
                    a_00[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_00[0] = size;
                    a_00[1]._4_4_ = iVar30;
                    a_00[2] = uVar19;
                    a_00[3] = (longlong)ptr_01;
                    b_00[1] = (longlong)ptr_00;
                    b_00[0] = uVar18;
                    b_00[2] = (longlong)ppVar31;
                    b_00[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
                    a_01[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_01[0] = size;
                    a_01[1]._4_4_ = iVar30;
                    a_01[2] = uVar19;
                    a_01[3] = (longlong)ptr_01;
                    b_01[1] = (longlong)ptr_00;
                    b_01[0] = uVar18;
                    b_01[2] = (longlong)ppVar31;
                    b_01[3] = (longlong)s2;
                    auVar26 = auVar24;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                    local_258._0_8_ = auVar24._0_8_;
                    local_258._8_8_ = auVar24._8_8_;
                    local_258._16_8_ = auVar24._16_8_;
                    local_258._24_8_ = auVar24._24_8_;
                    puVar1 = (undefined8 *)((long)*b_13 + sVar20);
                    *puVar1 = local_258._0_8_;
                    puVar1[1] = local_258._8_8_;
                    puVar1[2] = local_258._16_8_;
                    puVar1[3] = local_258._24_8_;
                    auVar28 = ZEXT3264(auVar26);
                    *(undefined1 (*) [32])((long)*ptr + sVar20) = auVar26;
                    auVar26 = auVar25;
                  }
                  auVar26 = vperm2i128_avx2(auVar27,auVar27,8);
                  auVar26 = vpalignr_avx2(auVar27,auVar26,8);
                  vpaddq_avx2(auVar26,(undefined1  [32])*ptr_01);
                  auVar28 = ZEXT3264(local_238);
                  a_02[1]._0_4_ = in_stack_fffffffffffffd60;
                  a_02[0] = size;
                  a_02[1]._4_4_ = iVar30;
                  a_02[2] = uVar19;
                  a_02[3] = (longlong)ptr_01;
                  b_02[1] = (longlong)ptr_00;
                  b_02[0] = uVar18;
                  b_02[2] = (longlong)ppVar31;
                  b_02[3] = (longlong)s2;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_02);
                  iVar14 = 2;
                  while( true ) {
                    auVar25 = auVar28._0_32_;
                    auVar27 = vperm2i128_avx2(auVar25,auVar25,8);
                    auVar27 = vpalignr_avx2(auVar25,auVar27,8);
                    bVar21 = iVar14 == 0;
                    iVar14 = iVar14 + -1;
                    if (bVar21) break;
                    vpaddq_avx2(auVar27,auVar23);
                    a_03[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_03[0] = size;
                    a_03[1]._4_4_ = iVar30;
                    a_03[2] = uVar19;
                    a_03[3] = (longlong)ptr_01;
                    b_03[1] = (longlong)ptr_00;
                    b_03[0] = uVar18;
                    b_03[2] = (longlong)ppVar31;
                    b_03[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_03);
                  }
                  local_238 = vpaddq_avx2(auVar27,ZEXT832(uVar8));
                  local_258._0_8_ = auVar26._0_8_;
                  local_258._8_8_ = auVar26._8_8_;
                  local_258._16_8_ = auVar26._16_8_;
                  local_258._24_8_ = auVar26._24_8_;
                  a_04[1]._0_4_ = in_stack_fffffffffffffd60;
                  a_04[0] = size;
                  a_04[1]._4_4_ = iVar30;
                  a_04[2] = uVar19;
                  a_04[3] = (longlong)ptr_01;
                  b_04[1] = (longlong)ptr_00;
                  b_04[0] = uVar18;
                  b_04[2] = (longlong)ppVar31;
                  b_04[3] = (longlong)s2;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                  a_05[1]._0_4_ = in_stack_fffffffffffffd60;
                  a_05[0] = size;
                  a_05[1]._4_4_ = iVar30;
                  a_05[2] = uVar19;
                  a_05[3] = (longlong)ptr_01;
                  b_05[1] = (longlong)ptr_00;
                  b_05[0] = uVar18;
                  b_05[2] = (longlong)ppVar31;
                  b_05[3] = (longlong)s2;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_05);
                  lVar16 = local_268;
                  for (sVar20 = 0; __n != sVar20; sVar20 = sVar20 + 0x20) {
                    auVar25 = *(undefined1 (*) [32])((long)*ptr + sVar20);
                    local_238 = vpsubq_avx2(local_238,auVar22);
                    auVar27._8_4_ = open;
                    auVar27._0_8_ = uVar12;
                    auVar27._12_4_ = 0;
                    auVar27._16_4_ = open;
                    auVar27._20_4_ = 0;
                    auVar27._24_4_ = open;
                    auVar27._28_4_ = 0;
                    vpsubq_avx2(local_258,auVar27);
                    a_06[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_06[0] = size;
                    a_06[1]._4_4_ = iVar30;
                    a_06[2] = uVar19;
                    a_06[3] = (longlong)ptr_01;
                    b_06[1] = (longlong)ptr_00;
                    b_06[0] = uVar18;
                    b_06[2] = (longlong)ppVar31;
                    b_06[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_06);
                    a_07[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_07[0] = size;
                    a_07[1]._4_4_ = iVar30;
                    a_07[2] = uVar19;
                    a_07[3] = (longlong)ptr_01;
                    b_07[1] = (longlong)ptr_00;
                    b_07[0] = uVar18;
                    b_07[2] = (longlong)ppVar31;
                    b_07[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_07,b_07);
                    a_08[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_08[0] = size;
                    a_08[1]._4_4_ = iVar30;
                    a_08[2] = uVar19;
                    a_08[3] = (longlong)ptr_01;
                    b_08[1] = (longlong)ptr_00;
                    b_08[0] = uVar18;
                    b_08[2] = (longlong)ppVar31;
                    b_08[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_08);
                    *(undefined1 (*) [32])((long)*b_14 + sVar20) = auVar25;
                    auVar26 = vpcmpgtq_avx2(auVar25,local_1b8);
                    local_1b8 = vblendvpd_avx(auVar25,local_1b8,auVar26);
                    a_09[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_09[0] = size;
                    a_09[1]._4_4_ = iVar30;
                    a_09[2] = uVar19;
                    a_09[3] = (longlong)ptr_01;
                    b_09[1] = (longlong)ptr_00;
                    b_09[0] = uVar18;
                    b_09[2] = (longlong)ppVar31;
                    b_09[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_09);
                    piVar3 = ((ppVar7->field_4).rowcols)->score_row;
                    local_258._0_4_ = auVar25._0_4_;
                    local_258._4_4_ = auVar25._4_4_;
                    local_258._8_4_ = auVar25._8_4_;
                    local_258._12_4_ = auVar25._12_4_;
                    local_258._16_4_ = auVar25._16_4_;
                    local_258._20_4_ = auVar25._20_4_;
                    local_258._24_4_ = auVar25._24_4_;
                    local_258._28_4_ = auVar25._28_4_;
                    *(undefined4 *)((long)piVar3 + lVar16) = local_258._0_4_;
                    *(undefined4 *)((long)piVar3 + lVar9 * 4 + lVar16) = local_258._8_4_;
                    *(undefined4 *)((long)piVar3 + lVar9 * 8 + lVar16) = local_258._16_4_;
                    *(undefined4 *)((long)piVar3 + lVar9 * 0xc + lVar16) = local_258._24_4_;
                    a_10[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_10[0] = size;
                    a_10[1]._4_4_ = iVar30;
                    a_10[2] = uVar19;
                    a_10[3] = (longlong)ptr_01;
                    b_10[1] = (longlong)ptr_00;
                    b_10[0] = uVar18;
                    b_10[2] = (longlong)ppVar31;
                    b_10[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_10,b_10);
                    local_1d8._4_4_ = local_258._4_4_;
                    local_1d8._0_4_ = local_258._0_4_;
                    local_1d8._8_4_ = local_258._8_4_;
                    local_1d8._12_4_ = local_258._12_4_;
                    local_1d8._16_4_ = local_258._16_4_;
                    local_1d8._20_4_ = local_258._20_4_;
                    local_1d8._24_4_ = local_258._24_4_;
                    local_1d8._28_4_ = local_258._28_4_;
                    lVar16 = lVar16 + uVar10 * 4;
                    local_258 = auVar25;
                  }
                  auVar26 = vpcmpgtq_avx2(local_1d8,local_d8);
                  if ((((auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') || SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      auVar26[0x1f] < '\0') {
                    vpermq_avx2(local_1d8,0x44);
                    a_11[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_11[0] = size;
                    a_11[1]._4_4_ = iVar30;
                    a_11[2] = uVar19;
                    a_11[3] = (longlong)ptr_01;
                    b_11[1] = (longlong)ptr_00;
                    b_11[0] = uVar18;
                    b_11[2] = (longlong)ppVar31;
                    b_11[3] = (longlong)s2;
                    auVar26 = local_1d8;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_11,b_11);
                    vpslldq_avx2(auVar26,8);
                    a_12[1]._0_4_ = in_stack_fffffffffffffd60;
                    a_12[0] = size;
                    a_12[1]._4_4_ = iVar30;
                    a_12[2] = uVar19;
                    a_12[3] = (longlong)ptr_01;
                    b_12[1] = (longlong)ptr_00;
                    b_12[0] = uVar18;
                    b_12[2] = (longlong)ppVar31;
                    b_12[3] = (longlong)s2;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_12,b_12);
                    __return_storage_ptr__ = ptr_00;
                    uVar19 = vpextrq_avx(auVar26._16_16_,1);
                    local_d8 = vpermq_avx2(auVar26,0xff);
                    ptr_00 = __return_storage_ptr__;
                    memcpy(__return_storage_ptr__,b_14,__n);
                    iVar30 = (int)uVar17;
                  }
                  local_268 = local_268 + 4;
                  sVar29 = size;
                }
                uVar12 = 0;
                while( true ) {
                  iVar14 = (int)uVar18;
                  if ((uVar11 & 0x1fffffff) << 2 == (uint)uVar12) break;
                  if ((*ptr_00)[uVar12] == uVar19) {
                    uVar6 = ((uint)uVar12 & 3) * uVar11 + ((uint)(uVar12 >> 2) & 0x3fffffff);
                    uVar18 = uVar18 & 0xffffffff;
                    if ((int)uVar6 < iVar14) {
                      uVar18 = (ulong)uVar6;
                    }
                  }
                  uVar12 = uVar12 + 1;
                }
                auVar25._8_8_ = uVar8;
                auVar25._0_8_ = uVar8;
                auVar25._16_8_ = uVar8;
                auVar25._24_8_ = uVar8;
                auVar23 = vpcmpgtq_avx2(auVar25,local_1b8);
                auVar24._8_8_ = lVar15;
                auVar24._0_8_ = lVar15;
                auVar24._16_8_ = lVar15;
                auVar24._24_8_ = lVar15;
                auVar26 = vpcmpgtq_avx2(local_138,auVar24);
                auVar23 = vpor_avx2(auVar26,auVar23);
                if ((((auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') || SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    auVar23[0x1f] < '\0') {
                  *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
                  uVar19 = 0;
                  iVar30 = 0;
                  iVar14 = 0;
                }
                ppVar7->score = (int)uVar19;
                ppVar7->end_query = iVar14;
                ppVar7->end_ref = iVar30;
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_14);
                parasail_free(ptr);
                parasail_free(b_13);
                return ppVar7;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar13 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_scan_profile_avx2_256_64",pcVar13);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        vH = _mm256_max_epi64_rpl(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}